

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O3

void Abc_NodeSetTravIdCurrent(Abc_Obj_t *p)

{
  undefined4 uVar1;
  int in_EDX;
  uint in_ESI;
  
  uVar1 = *(undefined4 *)&p[3].pNtk;
  Vec_IntFillExtra((Vec_Int_t *)&p[3].pNext,in_ESI + 1,in_EDX);
  if ((-1 < (int)in_ESI) && ((int)in_ESI < *(int *)((long)&p[3].pNext + 4))) {
    *(undefined4 *)(*(long *)&p[3].Id + (ulong)in_ESI * 4) = uVar1;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void        Abc_NodeSetTravIdCurrent( Abc_Obj_t * p )         { Abc_NodeSetTravId( p, Abc_ObjNtk(p)->nTravIds );                                      }